

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_parser.c
# Opt level: O0

RK_S32 mpp_hevc_output_frame(void *ctx,int flush)

{
  HEVCContext *s_00;
  long lVar1;
  bool bVar2;
  HEVCFrame *pHVar3;
  ulong uVar4;
  HEVCFrame *frame_next_ready;
  HEVCFrame *frame_1;
  HEVCFrame *frame;
  uint local_48;
  RK_U32 i;
  RK_S32 min_idx;
  RK_S32 min_poc;
  RK_S32 nb_output;
  RK_U32 find_next_ready;
  MppDecCfgSet *cfg;
  HEVCContext *s;
  H265dContext_t *h265dctx;
  int flush_local;
  void *ctx_local;
  
  s_00 = *ctx;
  lVar1 = *(long *)((long)ctx + 0x50);
  if (*(int *)(lVar1 + 0x1c) == 0) {
    while( true ) {
      min_idx = 0;
      i = 0x7fffffff;
      local_48 = 0;
      for (frame._4_4_ = 0; frame._4_4_ < 0x11; frame._4_4_ = frame._4_4_ + 1) {
        uVar4 = (ulong)frame._4_4_;
        if ((((s_00->DPB[uVar4].flags & 1) != 0) && (s_00->DPB[uVar4].sequence == s_00->seq_output))
           && (min_idx = min_idx + 1, s_00->DPB[uVar4].poc < (int)i)) {
          i = s_00->DPB[uVar4].poc;
          local_48 = frame._4_4_;
        }
      }
      if (((flush == 0) && (s_00->seq_output == s_00->seq_decode)) &&
         ((s_00->sps != (HEVCSPS *)0x0 &&
          (min_idx <= s_00->sps->temporal_layer[s_00->sps->max_sub_layers + -1].num_reorder_pics))))
      {
        if ((*(int *)(lVar1 + 0x38) == 0) ||
           (((s_00->nal_unit_type != NAL_IDR_W_RADL && (s_00->nal_unit_type != NAL_IDR_N_LP)) &&
            (((s_00->nal_unit_type != NAL_BLA_W_RADL &&
              ((s_00->nal_unit_type != NAL_BLA_W_LP && (s_00->nal_unit_type != NAL_BLA_N_LP)))) ||
             (s_00->first_i_fast_play != 0)))))) {
          return 0;
        }
        s_00->first_i_fast_play = 1;
      }
      if (min_idx != 0) {
        frame_next_ready = s_00->DPB + (int)local_48;
        frame_next_ready->flags = frame_next_ready->flags & 0xfe;
        s_00->output_frame_idx = (RK_U8)local_48;
        mpp_buf_slot_set_flag(s_00->slots,frame_next_ready->slot_index,SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue(s_00->slots,frame_next_ready->slot_index,QUEUE_DISPLAY);
        if ((h265d_debug & 0x80) != 0) {
          _mpp_log_l(4,"H265D_PARSER","Output frame with POC %d frame->slot_index = %d\n",
                     (char *)0x0,(ulong)(uint)frame_next_ready->poc,
                     (ulong)(uint)frame_next_ready->slot_index);
        }
        do {
          bVar2 = false;
          for (frame._4_4_ = 0; frame._4_4_ < 0x11; frame._4_4_ = frame._4_4_ + 1) {
            pHVar3 = s_00->DPB + frame._4_4_;
            if ((((pHVar3->flags & 1) != 0) && (pHVar3->sequence == s_00->seq_output)) &&
               (pHVar3->poc == frame_next_ready->poc + 1)) {
              bVar2 = true;
              s_00->output_frame_idx = (RK_U8)frame._4_4_;
              pHVar3->flags = pHVar3->flags & 0xfe;
              mpp_buf_slot_set_flag(s_00->slots,pHVar3->slot_index,SLOT_QUEUE_USE);
              mpp_buf_slot_enqueue(s_00->slots,pHVar3->slot_index,QUEUE_DISPLAY);
              if ((h265d_debug & 0x80) != 0) {
                _mpp_log_l(4,"H265D_PARSER",
                           "Output frame with POC %d frm_next_ready->slot_index = %d\n",(char *)0x0,
                           (ulong)(uint)pHVar3->poc,(ulong)(uint)pHVar3->slot_index);
              }
              for (frame._4_4_ = 0; frame_next_ready = pHVar3, frame._4_4_ < 0x11;
                  frame._4_4_ = frame._4_4_ + 1) {
                mpp_hevc_unref_frame(s_00,s_00->DPB + frame._4_4_,0);
              }
            }
          }
        } while (bVar2);
        return 1;
      }
      if (s_00->seq_output == s_00->seq_decode) break;
      s_00->seq_output = s_00->seq_output + 1 & 0xff;
    }
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = mpp_hevc_out_dec_order(ctx);
  }
  return ctx_local._4_4_;
}

Assistant:

static RK_S32 mpp_hevc_output_frame(void *ctx, int flush)
{

    H265dContext_t *h265dctx = (H265dContext_t *)ctx;
    HEVCContext *s = (HEVCContext *)h265dctx->priv_data;
    MppDecCfgSet *cfg = h265dctx->cfg;
    RK_U32 find_next_ready = 0;

    if (cfg->base.fast_out)
        return mpp_hevc_out_dec_order(ctx);

    do {
        RK_S32 nb_output = 0;
        RK_S32 min_poc   = INT_MAX;
        RK_S32 min_idx = 0;
        RK_U32 i;

        for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
            HEVCFrame *frame = &s->DPB[i];
            if ((frame->flags & HEVC_FRAME_FLAG_OUTPUT) &&
                frame->sequence == s->seq_output) {
                nb_output++;
                if (frame->poc < min_poc) {
                    min_poc = frame->poc;
                    min_idx = i;
                }
            }
        }

        /* wait for more frames before output */
        if (!flush && s->seq_output == s->seq_decode && s->sps &&
            nb_output <= s->sps->temporal_layer[s->sps->max_sub_layers - 1].num_reorder_pics) {
            if (cfg->base.enable_fast_play && (IS_IDR(s) ||
                                               (IS_BLA(s) && !s->first_i_fast_play))) {
                s->first_i_fast_play = 1;
            } else {
                return 0;
            }
        }

        if (nb_output) {
            HEVCFrame *frame = &s->DPB[min_idx];

            frame->flags &= ~(HEVC_FRAME_FLAG_OUTPUT);
            s->output_frame_idx = min_idx;

            mpp_buf_slot_set_flag(s->slots, frame->slot_index, SLOT_QUEUE_USE);
            mpp_buf_slot_enqueue(s->slots, frame->slot_index, QUEUE_DISPLAY);

            h265d_dbg(H265D_DBG_REF,
                      "Output frame with POC %d frame->slot_index = %d\n", frame->poc, frame->slot_index);

            do {
                find_next_ready = 0;
                for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
                    HEVCFrame *frame_next_ready = &s->DPB[i];
                    if ((frame_next_ready->flags & HEVC_FRAME_FLAG_OUTPUT) &&
                        frame_next_ready->sequence == s->seq_output) {
                        if (frame_next_ready->poc == frame->poc + 1) {
                            find_next_ready = 1;
                            s->output_frame_idx = i;
                            frame_next_ready->flags &= ~(HEVC_FRAME_FLAG_OUTPUT);
                            frame = frame_next_ready;
                            mpp_buf_slot_set_flag(s->slots, frame->slot_index, SLOT_QUEUE_USE);
                            mpp_buf_slot_enqueue(s->slots, frame->slot_index, QUEUE_DISPLAY);
                            h265d_dbg(H265D_DBG_REF,
                                      "Output frame with POC %d frm_next_ready->slot_index = %d\n",
                                      frame_next_ready->poc, frame_next_ready->slot_index);
                            /* release any frames that are now unused */
                            for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
                                mpp_hevc_unref_frame(s, &s->DPB[i], 0);
                            }
                        }
                    }
                }
            } while (find_next_ready);

            return 1;
        }

        if (s->seq_output != s->seq_decode)
            s->seq_output = (s->seq_output + 1) & 0xff;
        else
            break;
    } while (1);

    return 0;
}